

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<int,QByteArray>::insertOrAssign_impl<int_const&,QByteArray_const&>
          (QHash<int,_QByteArray> *this,int *key,QByteArray *value)

{
  QByteArray *in_RCX;
  TryEmplaceResult *in_RDI;
  TryEmplaceResult *r;
  QByteArray *in_stack_ffffffffffffffc8;
  QByteArray *in_stack_ffffffffffffffd0;
  TryEmplaceResult *pTVar1;
  
  (in_RDI->iterator).i.d =
       (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->iterator).i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->inserted = &DAT_aaaaaaaaaaaaaaaa;
  pTVar1 = in_RDI;
  tryEmplace<QByteArray_const&>
            ((QHash<int,_QByteArray> *)in_RDI,(int *)in_RDI,in_stack_ffffffffffffffd0);
  if ((pTVar1->inserted & 1U) == 0) {
    QHash<int,_QByteArray>::iterator::operator*((iterator *)0x864217);
    QByteArray::operator=(in_RCX,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

TryEmplaceResult insertOrAssign_impl(K &&key, Value &&value)
    {
        auto r = tryEmplace(std::forward<K>(key), std::forward<Value>(value));
        if (!r.inserted)
            *r.iterator = std::forward<Value>(value); // `value` is untouched if we get here
        return r;
    }